

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O0

void toggle(vmd_bst_t *tree,vmd_bst_rev_t *rev,vmd_bst_node_t **affected)

{
  int iVar1;
  vmd_bst_node_t **ppvVar2;
  void *pvVar3;
  void *tmp_2;
  void *tmp_1;
  int tmp;
  int i;
  vmd_bst_node_t **affected_local;
  vmd_bst_rev_t *rev_local;
  vmd_bst_t *tree_local;
  
  unfree_erased(tree,rev);
  for (tmp_1._4_4_ = 0; tmp_1._4_4_ < rev->erased_count; tmp_1._4_4_ = tmp_1._4_4_ + 1) {
    if (((byte)rev->erased[tmp_1._4_4_]->field_0x20 >> 5 & 1) == 0) {
      rev->erased[tmp_1._4_4_]->field_0x20 = rev->erased[tmp_1._4_4_]->field_0x20 & 0x7f;
      rev->erased[tmp_1._4_4_]->field_0x20 = rev->erased[tmp_1._4_4_]->field_0x20 & 0xdf | 0x20;
      slist_push(affected,rev->erased[tmp_1._4_4_]);
    }
    insert_node(tree,rev->erased[tmp_1._4_4_]);
  }
  for (tmp_1._4_4_ = 0; tmp_1._4_4_ < rev->inserted_count; tmp_1._4_4_ = tmp_1._4_4_ + 1) {
    if (((byte)rev->inserted[tmp_1._4_4_]->field_0x20 >> 5 & 1) == 0) {
      rev->inserted[tmp_1._4_4_]->field_0x20 = rev->inserted[tmp_1._4_4_]->field_0x20 & 0x7f | 0x80;
      rev->inserted[tmp_1._4_4_]->field_0x20 = rev->inserted[tmp_1._4_4_]->field_0x20 & 0xdf | 0x20;
      slist_push(affected,rev->inserted[tmp_1._4_4_]);
    }
    erase_node(tree,rev->inserted[tmp_1._4_4_]);
  }
  for (tmp_1._4_4_ = 0; tmp_1._4_4_ < rev->changed_count; tmp_1._4_4_ = tmp_1._4_4_ + 1) {
    erase_node(tree,rev->changed[tmp_1._4_4_]);
    memswap(&rev->changed[tmp_1._4_4_]->field_0x21,
            (void *)((long)rev->changed_data + (long)tmp_1._4_4_ * tree->csize),tree->csize);
    insert_node(tree,rev->changed[tmp_1._4_4_]);
  }
  iVar1 = rev->erased_count;
  rev->erased_count = rev->inserted_count;
  rev->inserted_count = iVar1;
  ppvVar2 = rev->erased;
  rev->erased = rev->inserted;
  rev->inserted = ppvVar2;
  pvVar3 = rev->erased_data;
  rev->erased_data = rev->uninserted_data;
  rev->uninserted_data = pvVar3;
  free_erased(tree,rev);
  return;
}

Assistant:

static void
toggle(bst_t *tree, bst_rev_t *rev, bst_node_t **affected)
{
	unfree_erased(tree, rev);

#ifndef DOXYGEN_IGNORE
#define ADD(node, was) \
	if (!node->inserted) { \
		node->was_in_tree = was; \
		node->inserted = 1; \
		slist_push(affected, node); \
	}
#endif
	int i;
	for (i = 0; i < rev->erased_count; i++) {
		ADD(rev->erased[i], 0);
		insert_node(tree, rev->erased[i]);
	}
	for (i = 0; i < rev->inserted_count; i++) {
		ADD(rev->inserted[i], 1);
		erase_node(tree, rev->inserted[i]);
	}
#undef ADD
	for (i = 0; i < rev->changed_count; i++) {
		//TODO: optimize
		erase_node(tree, rev->changed[i]);
		memswap(rev->changed[i]->data, rev->changed_data + i * tree->csize, tree->csize);
		insert_node(tree, rev->changed[i]);
	}

	SWAP(rev->erased_count, rev->inserted_count, int);
	SWAP(rev->erased, rev->inserted, void *);
	SWAP(rev->erased_data, rev->uninserted_data, void *);

	free_erased(tree, rev);
}